

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  FieldDescriptor *pFVar1;
  Descriptor *pDVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *proto_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_01;
  long lVar3;
  int i_1;
  int i;
  long lVar4;
  
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < file->extension_count_; lVar4 = lVar4 + 1) {
    pFVar1 = file->extensions_;
    proto_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                         (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,(int)lVar4)
    ;
    ValidateProto3Field(this,(FieldDescriptor *)(&pFVar1->super_SymbolBase + lVar3),proto_00);
    lVar3 = lVar3 + 0x58;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < file->message_type_count_; lVar4 = lVar4 + 1) {
    pDVar2 = file->message_types_;
    proto_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                         (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,
                          (int)lVar4);
    ValidateProto3Message(this,(Descriptor *)(&pDVar2->super_SymbolBase + lVar3),proto_01);
    lVar3 = lVar3 + 0xa0;
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3(const FileDescriptor* file,
                                       const FileDescriptorProto& proto) {
  for (int i = 0; i < file->extension_count(); ++i) {
    ValidateProto3Field(file->extensions_ + i, proto.extension(i));
  }
  for (int i = 0; i < file->message_type_count(); ++i) {
    ValidateProto3Message(file->message_types_ + i, proto.message_type(i));
  }
}